

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O1

void SelectiveBranchingMT::run(search *sch,multi_ex *ec)

{
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *this;
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *pvVar1;
  long lVar2;
  ulong *puVar3;
  pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *__seed;
  pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *ppVar4;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *__seed_00;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar5;
  void *__ptr;
  long lVar6;
  stringstream *this_00;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  _TmpBuf __buf;
  path original_final;
  BaseTask local_e0;
  search *local_a8;
  multi_ex *local_a0;
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *local_98;
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *local_90;
  v_array<std::pair<unsigned_int,_float>_> *local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  uint uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  v_array<std::pair<unsigned_int,_float>_> local_58;
  
  puVar3 = (ulong *)sch->metatask_data;
  this = (v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *)(puVar3 + 2);
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::clear(this);
  pvVar1 = (v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            *)(puVar3 + 6);
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::clear(pvVar1);
  local_88 = (v_array<std::pair<unsigned_int,_float>_> *)(puVar3 + 10);
  v_array<std::pair<unsigned_int,_float>_>::clear(local_88);
  *(undefined4 *)(puVar3 + 0xe) = 0;
  puVar3[0x10] = 0;
  local_e0._16_4_ = local_e0._16_4_ & 0xffffff00;
  local_e0._maybe_override_prediction = (_func_bool_search_ptr_size_t_action_ptr_float_ptr *)0x0;
  local_e0._foreach_action._0_4_ = 0x25aab6;
  local_e0._foreach_action._4_4_ = 0;
  local_e0._post_prediction._0_4_ = 0x25ab60;
  local_e0._post_prediction._4_4_ = 0;
  local_e0._with_output_string =
       run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_2::__invoke(Search::
       search&,std::__cxx11::stringstream__;
  local_a8 = sch;
  local_e0.sch = sch;
  local_e0.ec = ec;
  Search::BaseTask::Run(&local_e0);
  local_58.end_array = (pair<unsigned_int,_float> *)0x0;
  local_58.erase_count = 0;
  local_58._begin = (pair<unsigned_int,_float> *)0x0;
  local_58._end = (pair<unsigned_int,_float> *)0x0;
  v_array<std::pair<unsigned_int,_float>_>::clear(&local_58);
  push_many<std::pair<unsigned_int,float>>
            (&local_58,(pair<unsigned_int,_float> *)puVar3[10],
             (long)(puVar3[0xb] - (long)puVar3[10]) >> 3);
  local_e0.sch._0_4_ = (undefined4)puVar3[0xe];
  local_78 = SUB84(local_58._begin,0);
  uStack_74 = (undefined4)((ulong)local_58._begin >> 0x20);
  uStack_70 = (uint)local_58._end;
  uStack_6c = (undefined4)((ulong)local_58._end >> 0x20);
  local_68 = SUB84(local_58.end_array,0);
  uStack_64 = (undefined4)((ulong)local_58.end_array >> 0x20);
  uStack_60 = (undefined4)local_58.erase_count;
  uStack_5c = (undefined4)(local_58.erase_count >> 0x20);
  local_e0.ec._0_4_ = local_78;
  local_e0.ec._4_4_ = uStack_74;
  local_e0._16_4_ = uStack_70;
  local_e0._20_4_ = uStack_6c;
  local_e0._foreach_action._0_4_ = local_68;
  local_e0._foreach_action._4_4_ = uStack_64;
  local_e0._post_prediction._0_4_ = uStack_60;
  local_e0._post_prediction._4_4_ = uStack_5c;
  local_e0._maybe_override_prediction =
       (_func_bool_search_ptr_size_t_action_ptr_float_ptr *)puVar3[0x10];
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::push_back(pvVar1,(pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      *)&local_e0);
  __seed = (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)puVar3[2];
  ppVar4 = (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)puVar3[3];
  local_a0 = ec;
  if (__seed != ppVar4) {
    lVar6 = ((long)ppVar4 - (long)__seed >> 3) * -0x3333333333333333;
    std::
    _Temporary_buffer<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_*,_std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>
    ::_Temporary_buffer((_Temporary_buffer<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_*,_std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>
                         *)&local_e0,__seed,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    if (CONCAT44(local_e0._20_4_,local_e0._16_4_) == 0) {
      std::
      __inplace_stable_sort<std::pair<float,v_array<std::pair<unsigned_int,float>>>*,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__3>>
                (__seed,ppVar4);
    }
    else {
      std::
      __stable_sort_adaptive<std::pair<float,v_array<std::pair<unsigned_int,float>>>*,std::pair<float,v_array<std::pair<unsigned_int,float>>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__3>>
                (__seed,ppVar4,CONCAT44(local_e0._20_4_,local_e0._16_4_),
                 CONCAT44(local_e0.ec._4_4_,local_e0.ec._0_4_));
    }
    operator_delete((void *)CONCAT44(local_e0._20_4_,local_e0._16_4_));
  }
  uVar8 = ((long)(puVar3[3] - puVar3[2]) >> 3) * -0x3333333333333333;
  if (*puVar3 < uVar8) {
    uVar8 = *puVar3;
  }
  local_98 = pvVar1;
  local_90 = this;
  if (uVar8 != 0) {
    uVar8 = 0;
    do {
      puVar3[0xf] = uVar8;
      v_array<std::pair<unsigned_int,_float>_>::clear(local_88);
      *(undefined4 *)(puVar3 + 0xe) = 0;
      puVar3[0x10] = 0;
      local_e0.sch._0_4_ = SUB84(local_a8,0);
      local_e0.sch._4_4_ = (undefined4)((ulong)local_a8 >> 0x20);
      local_e0.ec._0_4_ = SUB84(local_a0,0);
      local_e0.ec._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
      local_e0._16_4_ = local_e0._16_4_ & 0xffffff00;
      local_e0._foreach_action._0_4_ = 0x25abe6;
      local_e0._foreach_action._4_4_ = 0;
      local_e0._maybe_override_prediction =
           run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_5::
           __invoke(Search::search__unsigned_long_unsigned_int__float__;
      local_e0._post_prediction._0_4_ = 0x25ac32;
      local_e0._post_prediction._4_4_ = 0;
      local_e0._with_output_string =
           run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_7::
           __invoke(Search::search&,std::__cxx11::stringstream__;
      Search::BaseTask::Run(&local_e0);
      local_58.end_array = (pair<unsigned_int,_float> *)0x0;
      local_58.erase_count = 0;
      local_58._begin = (pair<unsigned_int,_float> *)0x0;
      local_58._end = (pair<unsigned_int,_float> *)0x0;
      v_array<std::pair<unsigned_int,_float>_>::clear(&local_58);
      push_many<std::pair<unsigned_int,float>>
                (&local_58,(pair<unsigned_int,_float> *)puVar3[10],
                 (long)(puVar3[0xb] - (long)puVar3[10]) >> 3);
      local_e0.sch._0_4_ = (undefined4)puVar3[0xe];
      local_68 = SUB84(local_58.end_array,0);
      uStack_64 = (undefined4)((ulong)local_58.end_array >> 0x20);
      uStack_60 = (undefined4)local_58.erase_count;
      uStack_5c = (undefined4)(local_58.erase_count >> 0x20);
      local_78 = SUB84(local_58._begin,0);
      uStack_74 = (undefined4)((ulong)local_58._begin >> 0x20);
      uStack_70 = (uint)local_58._end;
      uStack_6c = (undefined4)((ulong)local_58._end >> 0x20);
      local_e0._post_prediction._4_4_ = uStack_5c;
      local_e0._20_4_ = uStack_6c;
      local_e0._foreach_action._0_4_ = local_68;
      local_e0._foreach_action._4_4_ = uStack_64;
      local_e0._post_prediction._0_4_ = uStack_60;
      local_e0.ec._0_4_ = local_78;
      local_e0.ec._4_4_ = uStack_74;
      local_e0._16_4_ = uStack_70;
      local_e0._maybe_override_prediction =
           (_func_bool_search_ptr_size_t_action_ptr_float_ptr *)puVar3[0x10];
      v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ::push_back(local_98,(pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                            *)&local_e0);
      uVar8 = uVar8 + 1;
      uVar9 = ((long)(puVar3[3] - puVar3[2]) >> 3) * -0x3333333333333333;
      if (*puVar3 < uVar9) {
        uVar9 = *puVar3;
      }
    } while (uVar8 < uVar9);
  }
  __seed_00 = (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)puVar3[6];
  ppVar5 = (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *)puVar3[7];
  if (__seed_00 != ppVar5) {
    lVar6 = ((long)ppVar5 - (long)__seed_00 >> 4) * -0x5555555555555555;
    std::
    _Temporary_buffer<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*,_std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::_Temporary_buffer((_Temporary_buffer<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*,_std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                         *)&local_e0,__seed_00,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    if (CONCAT44(local_e0._20_4_,local_e0._16_4_) == 0) {
      std::
      __inplace_stable_sort<std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>*,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__8>>
                (__seed_00,ppVar5);
    }
    else {
      std::
      __stable_sort_adaptive<std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>*,std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__8>>
                (__seed_00,ppVar5,CONCAT44(local_e0._20_4_,local_e0._16_4_),
                 CONCAT44(local_e0.ec._4_4_,local_e0.ec._0_4_));
    }
    operator_delete((void *)CONCAT44(local_e0._20_4_,local_e0._16_4_));
  }
  puVar3[0x11] = 0;
  if ((puVar3[0x10] != 0) && (puVar3[1] != 0)) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    puVar3[0x11] = (ulong)this_00;
    uVar8 = puVar3[6];
    uVar9 = ((long)(puVar3[7] - uVar8) >> 4) * -0x5555555555555555;
    if (puVar3[1] <= uVar9) {
      uVar9 = puVar3[1];
    }
    if (uVar9 != 0) {
      lVar6 = 0;
      uVar9 = 0;
      do {
        puVar11 = *(undefined8 **)(uVar8 + 0x28 + lVar6);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(puVar3[0x11] + 0x10),(char *)*puVar11,puVar11[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
        poVar7 = std::ostream::_M_insert<double>((double)*(float *)(puVar3[6] + lVar6));
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        uVar9 = uVar9 + 1;
        uVar8 = puVar3[6];
        uVar10 = ((long)(puVar3[7] - uVar8) >> 4) * -0x5555555555555555;
        if (puVar3[1] <= uVar10) {
          uVar10 = puVar3[1];
        }
        lVar6 = lVar6 + 0x30;
      } while (uVar9 < uVar10);
    }
  }
  puVar3[0xf] = 0;
  puVar3[0x10] = 0;
  local_e0.sch._0_4_ = SUB84(local_a8,0);
  local_e0.sch._4_4_ = (undefined4)((ulong)local_a8 >> 0x20);
  local_e0.ec._0_4_ = SUB84(local_a0,0);
  local_e0.ec._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
  local_e0._post_prediction._0_4_ = 0;
  local_e0._post_prediction._4_4_ = 0;
  local_e0._foreach_action._0_4_ = 0x25acb8;
  local_e0._foreach_action._4_4_ = 0;
  local_e0._maybe_override_prediction =
       run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_10::__invoke(Search::
       search__unsigned_long_unsigned_int__float__;
  local_e0._with_output_string =
       run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_11::__invoke(Search::
       search&,std::__cxx11::stringstream__;
  local_e0._final_run = true;
  Search::BaseTask::Run(&local_e0);
  pvVar1 = local_98;
  uVar8 = puVar3[2];
  if (puVar3[3] != uVar8) {
    lVar6 = 8;
    uVar9 = 0;
    do {
      if (*(void **)(uVar8 + lVar6) != (void *)0x0) {
        free(*(void **)(uVar8 + lVar6));
      }
      puVar11 = (undefined8 *)(uVar8 + lVar6);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11[2] = 0;
      uVar9 = uVar9 + 1;
      uVar8 = puVar3[2];
      lVar6 = lVar6 + 0x28;
    } while (uVar9 < (ulong)(((long)(puVar3[3] - uVar8) >> 3) * -0x3333333333333333));
  }
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::clear(local_90);
  uVar8 = puVar3[6];
  if (puVar3[7] != uVar8) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      __ptr = *(void **)(uVar8 + 8 + lVar6);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar2 = uVar8 + lVar6;
      *(undefined8 *)(lVar2 + 8) = 0;
      *(undefined8 *)(lVar2 + 0x10) = 0;
      *(undefined8 *)(lVar2 + 0x18) = 0;
      puVar11 = *(undefined8 **)((long)&pvVar1->_begin->second + lVar6);
      if (puVar11 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar11 != puVar11 + 2) {
          operator_delete((undefined8 *)*puVar11);
        }
        operator_delete(puVar11);
      }
      uVar9 = uVar9 + 1;
      uVar8 = puVar3[6];
      lVar6 = lVar6 + 0x30;
    } while (uVar9 < (ulong)(((long)(puVar3[7] - uVar8) >> 4) * -0x5555555555555555));
  }
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::clear(pvVar1);
  if ((long *)puVar3[0x11] != (long *)0x0) {
    (**(code **)(*(long *)puVar3[0x11] + 8))();
  }
  puVar3[0x11] = 0;
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& d = *sch.get_metatask_data<task_data>();

  // generate an initial trajectory, but record possible branches
  d.branches.clear();
  d.final.clear();
  d.trajectory.clear();
  d.total_cost = 0.;
  d.output_string = nullptr;

  cdbg << "*** INITIAL PASS ***" << endl;
  sch.base_task(ec)
      .foreach_action([](Search::search& sch, size_t t, float min_cost, action a, bool taken, float a_cost) -> void {
        cdbg << "==DebugMT== foreach_action(t=" << t << ", min_cost=" << min_cost << ", a=" << a << ", taken=" << taken
             << ", a_cost=" << a_cost << ")" << endl;
        if (taken)
          return;  // ignore the taken action
        task_data& d = *sch.get_metatask_data<task_data>();
        float delta = a_cost - min_cost;
        path branch = v_init<act_score>();
        push_many<act_score>(branch, d.trajectory.begin(), d.trajectory.size());
        branch.push_back(make_pair(a, a_cost));
        d.branches.push_back(make_pair(delta, branch));
        cdbg << "adding branch: " << delta << " -> " << branch << endl;
      })
      .post_prediction([](Search::search& sch, size_t /*t*/, action a, float a_cost) -> void {
        task_data& d = *sch.get_metatask_data<task_data>();
        d.trajectory.push_back(make_pair(a, a_cost));
        d.total_cost += a_cost;
      })
      .with_output_string([](Search::search& sch, stringstream& output) -> void {
        sch.get_metatask_data<task_data>()->output_string = new string(output.str());
      })
      .Run();

  // the last item the trajectory stack is complete and therefore not a branch
  // if (! d.branches.empty())
  //  d.branches.pop().second.delete_v();

  {
    // construct the final trajectory
    path original_final = v_init<act_score>();
    copy_array(original_final, d.trajectory);
    d.final.push_back(make_pair(make_pair(d.total_cost, original_final), d.output_string));
  }

  // sort the branches by cost
  stable_sort(
      d.branches.begin(), d.branches.end(), [](const branch& a, const branch& b) -> bool { return a.first < b.first; });

  // make new predictions
  for (size_t i = 0; i < min(d.max_branches, d.branches.size()); i++)
  {
    d.cur_branch = i;
    d.trajectory.clear();
    d.total_cost = 0.;
    d.output_string = nullptr;

    cdbg << "*** BRANCH " << i << " *** " << d.branches[i].first << " : " << d.branches[i].second << endl;
    sch.base_task(ec)
        .foreach_action([](Search::search& /*sch*/, size_t /*t*/, float /*min_cost*/, action /*a*/, bool /*taken*/,
                            float /*a_cost*/) -> void {})
        .maybe_override_prediction([](Search::search& sch, size_t t, action& a, float& a_cost) -> bool {
          task_data& d = *sch.get_metatask_data<task_data>();
          path& path = d.branches[d.cur_branch].second;
          if (t >= path.size())
            return false;
          a = path[t].first;
          a_cost = path[t].second;
          return true;
        })
        .post_prediction([](Search::search& sch, size_t /*t*/, action a, float a_cost) -> void {
          task_data& d = *sch.get_metatask_data<task_data>();
          d.trajectory.push_back(make_pair(a, a_cost));
          d.total_cost += a_cost;
        })
        .with_output_string([](Search::search& sch, stringstream& output) -> void {
          sch.get_metatask_data<task_data>()->output_string = new string(output.str());
        })
        .Run();

    {
      // construct the final trajectory
      path this_final = v_init<act_score>();
      copy_array(this_final, d.trajectory);
      d.final.push_back(make_pair(make_pair(d.total_cost, this_final), d.output_string));
    }
  }

  // sort the finals by cost
  stable_sort(
      d.final.begin(), d.final.end(), [](const pair<branch, string*>& a, const pair<branch, string*>& b) -> bool {
        return a.first.first < b.first.first;
      });

  d.kbest_out = nullptr;
  if (d.output_string && (d.kbest > 0))
  {
    d.kbest_out = new stringstream();
    for (size_t i = 0; i < min(d.final.size(), d.kbest); i++)
      (*d.kbest_out) << *d.final[i].second << "\t" << d.final[i].first.first << endl;
  }

  // run the final selected trajectory
  cdbg << "*** FINAL ***" << endl;
  d.cur_branch = 0;
  d.output_string = nullptr;
  sch.base_task(ec)
      .foreach_action([](Search::search& /*sch*/, size_t /*t*/, float /*min_cost*/, action /*a*/, bool /*taken*/,
                          float /*a_cost*/) -> void {})
      .maybe_override_prediction([](Search::search& sch, size_t t, action& a, float& a_cost) -> bool {
        task_data& d = *sch.get_metatask_data<task_data>();
        path& path = d.final[d.cur_branch].first.second;
        if ((t >= path.size()) || (path[t].first == (action)-1))
          return false;
        a = path[t].first;
        a_cost = path[t].second;
        return true;
      })
      .with_output_string([](Search::search& sch, stringstream& output) -> void {
        task_data& d = *sch.get_metatask_data<task_data>();
        if (d.kbest_out)
        {
          output.str("");
          output << d.kbest_out->str();
        }
      })
      .final_run()
      .Run();

  // clean up memory
  for (size_t i = 0; i < d.branches.size(); i++) d.branches[i].second.delete_v();
  d.branches.clear();
  for (size_t i = 0; i < d.final.size(); i++)
  {
    d.final[i].first.second.delete_v();
    delete d.final[i].second;
  }
  d.final.clear();
  if (d.kbest_out)
    delete d.kbest_out;
  d.kbest_out = nullptr;
}